

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

bool __thiscall ON_XMLNodePrivate::RemoveProperty(ON_XMLNodePrivate *this,wchar_t *name)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ON_XMLProperty *pOVar2;
  ON_XMLProperty **ppOVar3;
  ON_XMLProperty *pOVar4;
  bool bVar5;
  
  pOVar4 = this->m_first_property;
  bVar5 = pOVar4 != (ON_XMLProperty *)0x0;
  if (bVar5) {
    iVar1 = (*pOVar4->_vptr_ON_XMLProperty[2])(pOVar4);
    iVar1 = ON_wString::CompareNoCase((ON_wString *)CONCAT44(extraout_var,iVar1),name);
    if (iVar1 == 0) {
      pOVar2 = (ON_XMLProperty *)0x0;
    }
    else {
      do {
        pOVar2 = pOVar4;
        pOVar4 = pOVar2->_private->_next;
        bVar5 = pOVar4 != (ON_XMLProperty *)0x0;
        if (pOVar4 == (ON_XMLProperty *)0x0) {
          return bVar5;
        }
        iVar1 = (*pOVar4->_vptr_ON_XMLProperty[2])(pOVar4);
        iVar1 = ON_wString::CompareNoCase((ON_wString *)CONCAT44(extraout_var_00,iVar1),name);
      } while (iVar1 != 0);
    }
    iVar1 = (*pOVar4->_vptr_ON_XMLProperty[5])(pOVar4);
    if (pOVar2 == (ON_XMLProperty *)0x0) {
      ppOVar3 = &this->m_first_property;
    }
    else {
      ppOVar3 = &pOVar2->_private->_next;
    }
    *ppOVar3 = (ON_XMLProperty *)CONCAT44(extraout_var_01,iVar1);
    (*pOVar4->_vptr_ON_XMLProperty[1])(pOVar4);
  }
  return bVar5;
}

Assistant:

bool ON_XMLNodePrivate::RemoveProperty(const wchar_t* name)
{
  ON_XMLProperty* pPrev = nullptr;

  auto* pProp = m_first_property;
  while (nullptr != pProp)
  {
    if (pProp->Name().CompareNoCase(name) == 0)
    {
      if (nullptr == pPrev)
      {
        m_first_property = pProp->Next();
      }
      else
      {
        pPrev->_private->_next = pProp->Next();
      }

      delete pProp;
      return true;
    }

    pPrev = pProp;
    pProp = pProp->_private->_next;
  }

  return false;
}